

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O0

uint8_t GmmGetCompressionFormat(GMM_RESOURCE_FORMAT Format,GMM_LIB_CONTEXT *pGmmLibContext)

{
  uint8_t uVar1;
  GMM_PLATFORM_INFO *pGVar2;
  GMM_LIB_CONTEXT *pGmmLibContext_local;
  GMM_RESOURCE_FORMAT Format_local;
  
  if (((int)Format < 1) || (0x180 < (int)Format)) {
    uVar1 = '\r';
  }
  else {
    pGVar2 = GmmLib::Context::GetPlatformInfo(pGmmLibContext);
    uVar1 = pGVar2->FormatTable[Format].CompressionFormat.CompressionFormat;
  }
  return uVar1;
}

Assistant:

uint8_t GMM_STDCALL GmmGetCompressionFormat(GMM_RESOURCE_FORMAT Format, GMM_LIB_CONTEXT *pGmmLibContext)
{
    return (((Format > GMM_FORMAT_INVALID) &&
             (Format < GMM_RESOURCE_FORMATS)) ?
            pGmmLibContext->GetPlatformInfo().FormatTable[Format].CompressionFormat.CompressionFormat :
            GMM_UNIFIED_CMF_INVALID);
}